

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

APInt * __thiscall llvm::APInt::operator<<=(APInt *this,uint ShiftAmt)

{
  uint uVar1;
  APInt *pAVar2;
  uint64_t uVar3;
  
  uVar1 = this->BitWidth;
  if (uVar1 < ShiftAmt) {
    __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x389,"APInt &llvm::APInt::operator<<=(unsigned int)");
  }
  if (uVar1 < 0x41) {
    uVar3 = 0;
    if (uVar1 != ShiftAmt) {
      uVar3 = (this->U).VAL << ((byte)ShiftAmt & 0x3f);
    }
    (this->U).VAL = uVar3;
    pAVar2 = clearUnusedBits(this);
    return pAVar2;
  }
  shlSlowCase(this,ShiftAmt);
  return this;
}

Assistant:

APInt &operator<<=(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      if (ShiftAmt == BitWidth)
        U.VAL = 0;
      else
        U.VAL <<= ShiftAmt;
      return clearUnusedBits();
    }
    shlSlowCase(ShiftAmt);
    return *this;
  }